

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_err.cpp
# Opt level: O3

void CliWoption(char *option)

{
  bool bVar1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  _Base_ptr *pp_Var4;
  iterator __end2;
  char *__s1;
  char *pcVar5;
  iterator __begin2;
  
  if (*option == 0) {
    pcVar5 = bp;
    if (pass == 0) {
      pcVar5 = (char *)0x0;
    }
    Error("no argument after -W",pcVar5,PASS03);
    return;
  }
  iVar2 = (byte)*option - 0x6e;
  if ((iVar2 == 0) && (iVar2 = (byte)option[1] - 0x6f, iVar2 == 0)) {
    iVar2 = 0x2d - (uint)(byte)option[2];
  }
  else {
    iVar2 = -iVar2;
  }
  bVar1 = iVar2 != 0;
  __s1 = option + (ulong)(iVar2 == 0) * 3;
  iVar2 = strcmp(__s1,W_ENABLE_ALL);
  pcVar5 = W_FAKE;
  p_Var3 = w_texts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (iVar2 == 0) {
    if ((_Rb_tree_header *)w_texts._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
        &w_texts._M_t._M_impl.super__Rb_tree_header) {
      do {
        pp_Var4 = &p_Var3[1]._M_parent;
        if (pcVar5 == *(char **)(p_Var3 + 1)) {
          pp_Var4 = (_Base_ptr *)&DAT_0018e50b;
        }
        *(bool *)pp_Var4 = bVar1;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
      } while ((_Rb_tree_header *)p_Var3 != &w_texts._M_t._M_impl.super__Rb_tree_header);
    }
  }
  else {
    for (; (_Rb_tree_header *)p_Var3 != &w_texts._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      pcVar5 = *(char **)(p_Var3 + 1);
      iVar2 = strcmp(__s1,pcVar5);
      if (iVar2 == 0) {
        pp_Var4 = (_Base_ptr *)&DAT_0018e50b;
        if (W_FAKE != pcVar5) {
          pp_Var4 = &p_Var3[1]._M_parent;
        }
        *(bool *)pp_Var4 = bVar1;
        return;
      }
    }
    if (1 < pass - 1U) {
      WarningImpl((char *)0x0,"unknown warning id in -W option",__s1,W_PASS03);
      return;
    }
  }
  return;
}

Assistant:

void CliWoption(const char* option) {
	if (!option[0]) {
		// from command line 0 == pass, from source by OPT the pass is above zero
		Error("no argument after -W", (0 == pass) ? nullptr : bp, PASS03);
		return;
	}
	// check for specific id, with possible "no-" prefix ("-Wabs" vs "-Wno-abs")
	const bool enable = strncmp("no-", option, 3);
	const char* id = enable ? option : option + 3;
	// handle ID "all"
	if (!strcmp(id, W_ENABLE_ALL)) {
		for (auto & warning_entry : w_texts) warning_state(warning_entry) = enable;
		return;
	}
	auto warning_it = findWarningByIdText(id);
	if (w_texts.end() == warning_it) {
		Warning("unknown warning id in -W option", id, W_PASS03);
		return;
	}
	warning_state(*warning_it) = enable;
}